

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void VW::parse_example_label(vw *all,example *ec,string *label)

{
  pointer pcVar1;
  substring s;
  v_array<substring> words;
  
  words.end_array = (substring *)0x0;
  words.erase_count = 0;
  words._begin = (substring *)0x0;
  words._end = (substring *)0x0;
  pcVar1 = (label->_M_dataplus)._M_p;
  s.end = pcVar1 + label->_M_string_length;
  s.begin = pcVar1;
  tokenize<v_array<substring>>(' ',s,&words,false);
  (*(all->p->lp).parse_label)(all->p,all->sd,&ec->l,&words);
  v_array<substring>::clear(&words);
  v_array<substring>::delete_v(&words);
  return;
}

Assistant:

void parse_example_label(vw& all, example& ec, string label)
{
  v_array<substring> words = v_init<substring>();
  char* cstr = (char*)label.c_str();
  substring str = {cstr, cstr + label.length()};
  tokenize(' ', str, words);
  all.p->lp.parse_label(all.p, all.sd, &ec.l, words);
  words.clear();
  words.delete_v();
}